

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

Slice __thiscall leveldb::Version::LevelFileNumIterator::value(LevelFileNumIterator *this)

{
  int iVar1;
  Slice SVar2;
  
  iVar1 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((char)iVar1 != '\0') {
    EncodeFixed64(this->value_buf_,
                  (this->flist_->
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  )._M_impl.super__Vector_impl_data._M_start[this->index_]->number);
    EncodeFixed64(this->value_buf_ + 8,
                  (this->flist_->
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  )._M_impl.super__Vector_impl_data._M_start[this->index_]->file_size);
    SVar2.size_ = 0x10;
    SVar2.data_ = this->value_buf_;
    return SVar2;
  }
  __assert_fail("Valid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                ,0xc2,"virtual Slice leveldb::Version::LevelFileNumIterator::value() const");
}

Assistant:

Slice value() const override {
    assert(Valid());
    EncodeFixed64(value_buf_, (*flist_)[index_]->number);
    EncodeFixed64(value_buf_ + 8, (*flist_)[index_]->file_size);
    return Slice(value_buf_, sizeof(value_buf_));
  }